

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char.h
# Opt level: O0

char __thiscall
kj::parse::_::ParseOctEscape::operator()
          (ParseOctEscape *this,char first,Maybe<char> *second,Maybe<char> *third)

{
  char *pcVar1;
  char *digit2;
  char *_digit2325;
  char *digit1;
  char *_digit1323;
  char result;
  Maybe<char> *third_local;
  Maybe<char> *second_local;
  char first_local;
  ParseOctEscape *this_local;
  
  _digit1323._7_1_ = first - 0x30;
  pcVar1 = kj::_::readMaybe<char>(second);
  if (pcVar1 != (char *)0x0) {
    _digit1323._7_1_ = _digit1323._7_1_ * '\b' | *pcVar1 - 0x30U;
    pcVar1 = kj::_::readMaybe<char>(third);
    if (pcVar1 != (char *)0x0) {
      _digit1323._7_1_ = _digit1323._7_1_ << 3 | *pcVar1 - 0x30U;
    }
  }
  return _digit1323._7_1_;
}

Assistant:

inline char operator()(char first, Maybe<char> second, Maybe<char> third) const {
    char result = first - '0';
    KJ_IF_SOME(digit1, second) {
      result = (result << 3) | (digit1 - '0');
      KJ_IF_SOME(digit2, third) {
        result = (result << 3) | (digit2 - '0');
      }
    }
    return result;
  }